

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSkinMeshBuffer.h
# Opt level: O1

void __thiscall irr::scene::SSkinMeshBuffer::convertToTangents(SSkinMeshBuffer *this)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  iterator iVar3;
  ulong uVar4;
  pointer pSVar5;
  pointer pSVar6;
  long lVar7;
  S3DVertexTangents Vertex;
  S3DVertexTangents local_78;
  
  if (this->VertexType == EVT_STANDARD) {
    pSVar6 = (pointer)(this->Vertices_Standard).m_data.
                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->Vertices_Standard).m_data.
                            super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 2) *
        0x38e38e39 != 0) {
      lVar7 = 0x1c;
      uVar4 = 0;
      do {
        local_78.Tangent.Z = 0.0;
        local_78.Binormal.X = 0.0;
        local_78.Binormal.Y = 0.0;
        local_78.Binormal.Z = 0.0;
        local_78.Tangent.X = 0.0;
        local_78.Tangent.Y = 0.0;
        local_78.super_S3DVertex.Color.color = *(u32 *)((long)pSVar6 + lVar7 + -4);
        local_78.super_S3DVertex.Pos.Z = *(float *)((long)pSVar6 + lVar7 + -0x14);
        local_78.super_S3DVertex.Pos._0_8_ = *(undefined8 *)((long)pSVar6 + lVar7 + -0x1c);
        local_78.super_S3DVertex.Normal.Z = *(float *)((long)pSVar6 + lVar7 + -8);
        uVar2 = *(undefined8 *)((long)pSVar6 + lVar7 + -0x10);
        local_78.super_S3DVertex.Normal.X = (float)uVar2;
        local_78.super_S3DVertex.Normal.Y = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)&(pSVar6->super_S3DVertex).Pos + lVar7);
        local_78.super_S3DVertex.TCoords.X = (float)uVar2;
        local_78.super_S3DVertex.TCoords.Y = (float)((ulong)uVar2 >> 0x20);
        iVar3._M_current = *(S3DVertexTangents **)&(this->super_IMeshBuffer).field_0x10;
        if (iVar3._M_current == *(S3DVertexTangents **)&(this->super_IMeshBuffer).field_0x18) {
          ::std::vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>
          ::_M_realloc_insert<irr::video::S3DVertexTangents_const&>
                    ((vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>
                      *)&(this->super_IMeshBuffer).field_0x8,iVar3,&local_78);
        }
        else {
          *(undefined8 *)&((iVar3._M_current)->Tangent).Z = 0;
          ((iVar3._M_current)->Binormal).Y = 0.0;
          ((iVar3._M_current)->Binormal).Z = 0.0;
          *(ulong *)&((iVar3._M_current)->super_S3DVertex).TCoords.Y =
               (ulong)(uint)local_78.super_S3DVertex.TCoords.Y;
          ((iVar3._M_current)->Tangent).Y = 0.0;
          ((iVar3._M_current)->Tangent).Z = 0.0;
          ((iVar3._M_current)->super_S3DVertex).Normal.Y = local_78.super_S3DVertex.Normal.Y;
          ((iVar3._M_current)->super_S3DVertex).Normal.Z = local_78.super_S3DVertex.Normal.Z;
          ((iVar3._M_current)->super_S3DVertex).Color = (SColor)local_78.super_S3DVertex.Color.color
          ;
          ((iVar3._M_current)->super_S3DVertex).TCoords.X = local_78.super_S3DVertex.TCoords.X;
          ((iVar3._M_current)->super_S3DVertex).Pos.X = local_78.super_S3DVertex.Pos.X;
          ((iVar3._M_current)->super_S3DVertex).Pos.Y = local_78.super_S3DVertex.Pos.Y;
          *(ulong *)&((iVar3._M_current)->super_S3DVertex).Pos.Z =
               CONCAT44(local_78.super_S3DVertex.Normal.X,local_78.super_S3DVertex.Pos.Z);
          puVar1 = &(this->super_IMeshBuffer).field_0x10;
          *(long *)puVar1 = *(long *)puVar1 + 0x3c;
        }
        this->field_0x20 = 0;
        uVar4 = uVar4 + 1;
        pSVar6 = (pointer)(this->Vertices_Standard).m_data.
                          super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x24;
      } while (uVar4 < (uint)((int)((ulong)((long)(this->Vertices_Standard).m_data.
                                                  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pSVar6) >> 2) * 0x38e38e39));
    }
    pSVar5 = (pointer)(this->Vertices_Standard).m_data.
                      super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Vertices_Standard).m_data.
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Vertices_Standard).m_data.
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->Vertices_Standard).m_data.
    super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x60;
  }
  else {
    if (this->VertexType != EVT_2TCOORDS) {
      return;
    }
    pSVar6 = (this->Vertices_2TCoords).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(this->Vertices_2TCoords).m_data.
                            super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 2) *
        -0x45d1745d != 0) {
      lVar7 = 0x1c;
      uVar4 = 0;
      do {
        local_78.Tangent.Z = 0.0;
        local_78.Binormal.X = 0.0;
        local_78.Binormal.Y = 0.0;
        local_78.Binormal.Z = 0.0;
        local_78.Tangent.X = 0.0;
        local_78.Tangent.Y = 0.0;
        local_78.super_S3DVertex.Color.color = *(u32 *)((long)pSVar6 + lVar7 + -4);
        local_78.super_S3DVertex.Pos.Z = *(float *)((long)pSVar6 + lVar7 + -0x14);
        local_78.super_S3DVertex.Pos._0_8_ = *(undefined8 *)((long)pSVar6 + lVar7 + -0x1c);
        local_78.super_S3DVertex.Normal.Z = *(float *)((long)pSVar6 + lVar7 + -8);
        uVar2 = *(undefined8 *)((long)pSVar6 + lVar7 + -0x10);
        local_78.super_S3DVertex.Normal.X = (float)uVar2;
        local_78.super_S3DVertex.Normal.Y = (float)((ulong)uVar2 >> 0x20);
        uVar2 = *(undefined8 *)((long)&(pSVar6->super_S3DVertex).Pos + lVar7);
        local_78.super_S3DVertex.TCoords.X = (float)uVar2;
        local_78.super_S3DVertex.TCoords.Y = (float)((ulong)uVar2 >> 0x20);
        iVar3._M_current = *(S3DVertexTangents **)&(this->super_IMeshBuffer).field_0x10;
        if (iVar3._M_current == *(S3DVertexTangents **)&(this->super_IMeshBuffer).field_0x18) {
          ::std::vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>
          ::_M_realloc_insert<irr::video::S3DVertexTangents_const&>
                    ((vector<irr::video::S3DVertexTangents,std::allocator<irr::video::S3DVertexTangents>>
                      *)&(this->super_IMeshBuffer).field_0x8,iVar3,&local_78);
        }
        else {
          *(undefined8 *)&((iVar3._M_current)->Tangent).Z = 0;
          ((iVar3._M_current)->Binormal).Y = 0.0;
          ((iVar3._M_current)->Binormal).Z = 0.0;
          *(ulong *)&((iVar3._M_current)->super_S3DVertex).TCoords.Y =
               (ulong)(uint)local_78.super_S3DVertex.TCoords.Y;
          ((iVar3._M_current)->Tangent).Y = 0.0;
          ((iVar3._M_current)->Tangent).Z = 0.0;
          ((iVar3._M_current)->super_S3DVertex).Normal.Y = local_78.super_S3DVertex.Normal.Y;
          ((iVar3._M_current)->super_S3DVertex).Normal.Z = local_78.super_S3DVertex.Normal.Z;
          ((iVar3._M_current)->super_S3DVertex).Color = (SColor)local_78.super_S3DVertex.Color.color
          ;
          ((iVar3._M_current)->super_S3DVertex).TCoords.X = local_78.super_S3DVertex.TCoords.X;
          ((iVar3._M_current)->super_S3DVertex).Pos.X = local_78.super_S3DVertex.Pos.X;
          ((iVar3._M_current)->super_S3DVertex).Pos.Y = local_78.super_S3DVertex.Pos.Y;
          *(ulong *)&((iVar3._M_current)->super_S3DVertex).Pos.Z =
               CONCAT44(local_78.super_S3DVertex.Normal.X,local_78.super_S3DVertex.Pos.Z);
          puVar1 = &(this->super_IMeshBuffer).field_0x10;
          *(long *)puVar1 = *(long *)puVar1 + 0x3c;
        }
        this->field_0x20 = 0;
        uVar4 = uVar4 + 1;
        pSVar6 = (this->Vertices_2TCoords).m_data.
                 super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x2c;
      } while (uVar4 < (uint)((int)((ulong)((long)(this->Vertices_2TCoords).m_data.
                                                  super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pSVar6) >> 2) * -0x45d1745d));
    }
    pSVar5 = (this->Vertices_2TCoords).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Vertices_2TCoords).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Vertices_2TCoords).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->Vertices_2TCoords).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar7 = 0x40;
  }
  if (pSVar6 != (pointer)0x0) {
    operator_delete(pSVar6,(long)pSVar5 - (long)pSVar6);
  }
  *(undefined1 *)((long)&(this->super_IMeshBuffer)._vptr_IMeshBuffer + lVar7) = 1;
  this->VertexType = EVT_TANGENTS;
  return;
}

Assistant:

void convertToTangents()
	{
		if (VertexType == video::EVT_STANDARD) {
			for (u32 n = 0; n < Vertices_Standard.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_Standard[n].Color;
				Vertex.Pos = Vertices_Standard[n].Pos;
				Vertex.Normal = Vertices_Standard[n].Normal;
				Vertex.TCoords = Vertices_Standard[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_Standard.clear();
			VertexType = video::EVT_TANGENTS;
		} else if (VertexType == video::EVT_2TCOORDS) {
			for (u32 n = 0; n < Vertices_2TCoords.size(); ++n) {
				video::S3DVertexTangents Vertex;
				Vertex.Color = Vertices_2TCoords[n].Color;
				Vertex.Pos = Vertices_2TCoords[n].Pos;
				Vertex.Normal = Vertices_2TCoords[n].Normal;
				Vertex.TCoords = Vertices_2TCoords[n].TCoords;
				Vertices_Tangents.push_back(Vertex);
			}
			Vertices_2TCoords.clear();
			VertexType = video::EVT_TANGENTS;
		}
	}